

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O1

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcStatesStates
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,int *states1,double *matrices1,
          int *states2,double *matrices2,int startPattern,int endPattern)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  int local_64;
  
  iVar1 = this->kCategoryCount;
  if (0 < iVar1) {
    iVar2 = this->kPartialsPaddedStateCount;
    iVar3 = this->kPatternCount;
    iVar4 = this->kStateCount;
    iVar5 = this->kMatrixSize;
    iVar9 = 0;
    local_64 = 0;
    do {
      if (startPattern < endPattern) {
        iVar12 = (iVar3 * local_64 + startPattern) * iVar2;
        iVar6 = this->kTransPaddedStateCount;
        lVar11 = (long)startPattern;
        do {
          if (0 < iVar4) {
            iVar7 = states2[lVar11];
            iVar8 = states1[lVar11];
            lVar13 = 0;
            lVar10 = (long)iVar9;
            do {
              destP[iVar12 + lVar13] = matrices1[iVar8 + lVar10] * matrices2[iVar7 + lVar10];
              lVar10 = lVar10 + iVar6;
              lVar13 = lVar13 + 1;
            } while (iVar4 != (int)lVar13);
            iVar12 = iVar12 + (int)lVar13;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != endPattern);
      }
      local_64 = local_64 + 1;
      iVar9 = iVar9 + iVar5;
    } while (local_64 != iVar1);
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcStatesStates(REALTYPE* destP,
                                                         const int* states1,
                                                         const REALTYPE* matrices1,
                                                         const int* states2,
                                                         const REALTYPE* matrices2,
                                                         int startPattern,
                                                         int endPattern) {

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        for (int k = startPattern; k < endPattern; k++) {
            const int state1 = states1[k];
            const int state2 = states2[k];
            if (DEBUGGING_OUTPUT) {
                std::cerr << "calcStatesStates s1 = " << state1 << '\n';
                std::cerr << "calcStatesStates s2 = " << state2 << '\n';
            }
            int w = l * kMatrixSize;
            for (int i = 0; i < kStateCount; i++) {
                destP[v] = matrices1[w + state1] * matrices2[w + state2];
                v++;

                w += kTransPaddedStateCount;
            }
            if (P_PAD) {
                for (int pad = 0; pad < P_PAD; pad++)  {
                    destP[v] = 0.0;
                    v++;
                }
            }
        }
    }
}